

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O1

void pinger_read_cb(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  pinger_t *pinger;
  undefined1 auVar1 [16];
  uint uVar2;
  size_t sVar3;
  int iVar4;
  long *plVar5;
  long *__ptr;
  long lVar6;
  int64_t eval_b;
  int64_t eval_a;
  long lStack_70;
  uv_buf_t *puStack_68;
  undefined8 uStack_60;
  long lStack_58;
  uv_buf_t *puStack_50;
  long local_48;
  long local_40;
  uv_stream_t *local_38;
  
  iVar4 = (int)&local_48;
  if (nread < 0) {
    local_48 = -0xfff;
    local_40 = nread;
    if (nread == -0xfff) {
      puStack_50 = (uv_buf_t *)0x1afc35;
      puts("got EOF");
      puStack_50 = (uv_buf_t *)0x1afc3d;
      free(buf->base);
      uv_close(stream,pinger_on_close);
      return;
    }
LAB_001afc8e:
    plVar5 = &local_40;
    puStack_50 = (uv_buf_t *)pinger_after_write;
    pinger_read_cb_cold_2();
    lStack_58 = (long)iVar4;
    uStack_60 = 0;
    puStack_50 = buf;
    if (lStack_58 == 0) {
      puStack_68 = (uv_buf_t *)0x1afcc6;
      free((void *)*plVar5);
      free(plVar5);
      return;
    }
    plVar5 = &lStack_58;
    puStack_68 = (uv_buf_t *)pinger_on_close;
    pinger_after_write_cold_1();
    __ptr = (long *)*plVar5;
    lStack_70 = 1000;
    puStack_68 = buf;
    if (*(int *)((long)__ptr + 4) != 1000) {
      plVar5 = &lStack_70;
      pinger_on_close_cold_1();
      if ((long *)*plVar5 != (long *)0x0) {
        plVar5 = (long *)*plVar5;
      }
      free(plVar5);
      return;
    }
    if (__ptr + 2 != plVar5) {
      uv_close(__ptr + 2,ponger_on_close);
      __ptr = plVar5;
    }
    free(__ptr);
    completed_pingers = completed_pingers + 1;
    return;
  }
  local_38 = stream;
  if (nread != 0) {
    pinger = (pinger_t *)stream->data;
    lVar6 = 0;
    do {
      local_40 = (long)buf->base[lVar6];
      uVar2 = pinger->state;
      local_48 = (long)pinger->pong[uVar2];
      if (local_40 != local_48) {
        puStack_50 = (uv_buf_t *)0x1afc8e;
        pinger_read_cb_cold_1();
        goto LAB_001afc8e;
      }
      puStack_50 = (uv_buf_t *)0x1afbc8;
      sVar3 = strlen(pinger->pong);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = sVar3;
      auVar1 = ZEXT416(uVar2 + 1) % auVar1;
      pinger->state = auVar1._0_4_;
      if (auVar1._0_8_ == 0) {
        puStack_50 = (uv_buf_t *)0x1afbec;
        printf("PONG %d\n",(ulong)pinger->pongs);
        uVar2 = pinger->pongs + 1;
        pinger->pongs = uVar2;
        if (999 < uVar2) {
          puStack_50 = (uv_buf_t *)0x1afc6b;
          uv_close(local_38,pinger_on_close);
          break;
        }
        puStack_50 = (uv_buf_t *)0x1afc07;
        pinger_write_ping(pinger);
      }
      lVar6 = lVar6 + 1;
    } while (nread != lVar6);
  }
  free(buf->base);
  return;
}

Assistant:

static void pinger_read_cb(uv_stream_t* stream,
                           ssize_t nread,
                           const uv_buf_t* buf) {
  ssize_t i;
  pinger_t* pinger;

  pinger = (pinger_t*) stream->data;

  if (nread < 0) {
    ASSERT_EQ(nread, UV_EOF);

    puts("got EOF");
    free(buf->base);

    uv_close((uv_handle_t*) stream, pinger_on_close);

    return;
  }

  /* Now we count the pongs */
  for (i = 0; i < nread; i++) {
    ASSERT_EQ(buf->base[i], pinger->pong[pinger->state]);
    pinger->state = (pinger->state + 1) % strlen(pinger->pong);

    if (pinger->state != 0)
      continue;

    printf("PONG %d\n", pinger->pongs);
    pinger->pongs++;

    if (pinger->pongs < NUM_PINGS) {
      pinger_write_ping(pinger);
    } else {
      uv_close((uv_handle_t*) stream, pinger_on_close);
      break;
    }
  }

  free(buf->base);
}